

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix.cc
# Opt level: O1

ssize_t __thiscall
serial::Serial::SerialImpl::write(SerialImpl *this,int __fd,void *__buf,size_t __n)

{
  uint __fd_00;
  double dVar1;
  byte bVar2;
  SerialImpl *pSVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  ssize_t sVar8;
  void *pvVar9;
  int *piVar10;
  IOException *pIVar11;
  PortNotOpenedException *this_00;
  SerialException *this_01;
  undefined4 in_register_00000034;
  bool bVar12;
  timespec timeout;
  fd_set writefds;
  MillisecondTimer total_timeout;
  timespec local_130;
  long local_120;
  SerialImpl *local_118;
  long local_110;
  string local_108;
  string local_e8;
  fd_set local_c8;
  MillisecondTimer local_40;
  
  local_120 = CONCAT44(in_register_00000034,__fd);
  if (this->is_open_ == false) {
    this_00 = (PortNotOpenedException *)__cxa_allocate_exception(0x48);
    PortNotOpenedException::PortNotOpenedException(this_00,"Serial::write");
    __cxa_throw(this_00,&PortNotOpenedException::typeinfo,
                PortNotOpenedException::~PortNotOpenedException);
  }
  local_118 = this;
  MillisecondTimer::MillisecondTimer
            (&local_40,
             (this->timeout_).write_timeout_multiplier * (int)__buf +
             (this->timeout_).write_timeout_constant);
  local_110 = local_40.expiry.tv_sec;
  bVar2 = 1;
  pvVar9 = (void *)0x0;
  do {
    if (__buf < pvVar9 || (long)__buf - (long)pvVar9 == 0) {
      return (ssize_t)pvVar9;
    }
    clock_gettime(1,&local_130);
    pSVar3 = local_118;
    uVar7 = (ulong)((double)(long)((double)(local_110 - local_130.tv_sec) * 1000.0) +
                   (double)(local_40.expiry.tv_nsec - local_130.tv_nsec) / 1000000.0);
    bVar12 = true;
    if (!(bool)((long)uVar7 < 1 & (bVar2 ^ 1))) {
      dVar1 = (double)(uVar7 & 0xffffffff);
      local_130.tv_sec = (__time_t)(dVar1 / 1000.0);
      local_130.tv_nsec = (long)((dVar1 - (double)local_130.tv_sec * 1000.0) * 1000000.0);
      local_c8.fds_bits[0] = 0;
      local_c8.fds_bits[1] = 0;
      local_c8.fds_bits[2] = 0;
      local_c8.fds_bits[3] = 0;
      local_c8.fds_bits[4] = 0;
      local_c8.fds_bits[5] = 0;
      local_c8.fds_bits[6] = 0;
      local_c8.fds_bits[7] = 0;
      local_c8.fds_bits[8] = 0;
      local_c8.fds_bits[9] = 0;
      local_c8.fds_bits[10] = 0;
      local_c8.fds_bits[0xb] = 0;
      local_c8.fds_bits[0xc] = 0;
      local_c8.fds_bits[0xd] = 0;
      local_c8.fds_bits[0xe] = 0;
      local_c8.fds_bits[0xf] = 0;
      iVar5 = local_118->fd_;
      iVar4 = iVar5 + 0x3f;
      if (-1 < iVar5) {
        iVar4 = iVar5;
      }
      local_c8.fds_bits[iVar4 >> 6] =
           local_c8.fds_bits[iVar4 >> 6] | 1L << ((byte)(iVar5 % 0x40) & 0x3f);
      iVar5 = pselect(iVar5 + 1,(fd_set *)0x0,&local_c8,(fd_set *)0x0,&local_130,(__sigset_t *)0x0);
      if (iVar5 < 0) {
        piVar10 = __errno_location();
        iVar5 = 2;
        if (*piVar10 != 4) {
          pIVar11 = (IOException *)__cxa_allocate_exception(0x78);
          local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_e8,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/shuai132[P]serial/src/impl/unix.cc"
                     ,"");
          IOException::IOException(pIVar11,&local_e8,0x28a,*piVar10);
          __cxa_throw(pIVar11,&IOException::typeinfo,IOException::~IOException);
        }
      }
      else if (iVar5 == 0) {
        iVar5 = 3;
      }
      else {
        __fd_00 = pSVar3->fd_;
        uVar6 = __fd_00 + 0x3f;
        if (-1 < (int)__fd_00) {
          uVar6 = __fd_00;
        }
        if (((ulong)local_c8.fds_bits[(int)uVar6 >> 6] >> ((ulong)__fd_00 & 0x3f) & 1) == 0)
        goto LAB_00109839;
        sVar8 = ::write(__fd_00,(void *)(local_120 + (long)pvVar9),(long)__buf - (long)pvVar9);
        if (sVar8 < 1) {
          this_01 = (SerialException *)__cxa_allocate_exception(0x28);
          SerialException::SerialException
                    (this_01,
                     "device reports readiness to write but returned no data (device disconnected?)"
                    );
LAB_00109969:
          __cxa_throw(this_01,&SerialException::typeinfo,SerialException::~SerialException);
        }
        pvVar9 = (void *)(sVar8 + (long)pvVar9);
        if (pvVar9 == __buf) {
          iVar5 = 3;
LAB_001097fb:
          bVar12 = false;
        }
        else {
          iVar5 = 0;
          if (pvVar9 < __buf) {
            iVar5 = 2;
            goto LAB_001097fb;
          }
          bVar12 = true;
          if (__buf < pvVar9) {
            this_01 = (SerialException *)__cxa_allocate_exception(0x28);
            SerialException::SerialException
                      (this_01,
                       "write over wrote, too many bytes where written, this shouldn\'t happen, might be a logical error!"
                      );
            goto LAB_00109969;
          }
        }
        if (bVar12) {
LAB_00109839:
          pIVar11 = (IOException *)__cxa_allocate_exception(0x78);
          local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_108,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/shuai132[P]serial/src/impl/unix.cc"
                     ,"");
          IOException::IOException
                    (pIVar11,&local_108,0x2b3,
                     "select reports ready to write, but our fd isn\'t in the list, this shouldn\'t happen!"
                    );
          __cxa_throw(pIVar11,&IOException::typeinfo,IOException::~IOException);
        }
      }
      bVar12 = iVar5 == 3;
      bVar2 = 0;
    }
    if (bVar12) {
      return (ssize_t)pvVar9;
    }
  } while( true );
}

Assistant:

size_t
Serial::SerialImpl::write (const uint8_t *data, size_t length)
{
  if (is_open_ == false) {
    throw PortNotOpenedException ("Serial::write");
  }
  fd_set writefds;
  size_t bytes_written = 0;

  // Calculate total timeout in milliseconds t_c + (t_m * N)
  long total_timeout_ms = timeout_.write_timeout_constant;
  total_timeout_ms += timeout_.write_timeout_multiplier * static_cast<long> (length);
  MillisecondTimer total_timeout(total_timeout_ms);

  bool first_iteration = true;
  while (bytes_written < length) {
    int64_t timeout_remaining_ms = total_timeout.remaining();
    // Only consider the timeout if it's not the first iteration of the loop
    // otherwise a timeout of 0 won't be allowed through
    if (!first_iteration && (timeout_remaining_ms <= 0)) {
      // Timed out
      break;
    }
    first_iteration = false;

    timespec timeout(timespec_from_ms(timeout_remaining_ms));

    FD_ZERO (&writefds);
    FD_SET (fd_, &writefds);

    // Do the select
    int r = pselect (fd_ + 1, NULL, &writefds, NULL, &timeout, NULL);

    // Figure out what happened by looking at select's response 'r'
    /** Error **/
    if (r < 0) {
      // Select was interrupted, try again
      if (errno == EINTR) {
        continue;
      }
      // Otherwise there was some error
      THROW (IOException, errno);
    }
    /** Timeout **/
    if (r == 0) {
      break;
    }
    /** Port ready to write **/
    if (r > 0) {
      // Make sure our file descriptor is in the ready to write list
      if (FD_ISSET (fd_, &writefds)) {
        // This will write some
        ssize_t bytes_written_now =
          ::write (fd_, data + bytes_written, length - bytes_written);
        // write should always return some data as select reported it was
        // ready to write when we get to this point.
        if (bytes_written_now < 1) {
          // Disconnected devices, at least on Linux, show the
          // behavior that they are always ready to write immediately
          // but writing returns nothing.
          throw SerialException ("device reports readiness to write but "
                                 "returned no data (device disconnected?)");
        }
        // Update bytes_written
        bytes_written += static_cast<size_t> (bytes_written_now);
        // If bytes_written == size then we have written everything we need to
        if (bytes_written == length) {
          break;
        }
        // If bytes_written < size then we have more to write
        if (bytes_written < length) {
          continue;
        }
        // If bytes_written > size then we have over written, which shouldn't happen
        if (bytes_written > length) {
          throw SerialException ("write over wrote, too many bytes where "
                                 "written, this shouldn't happen, might be "
                                 "a logical error!");
        }
      }
      // This shouldn't happen, if r > 0 our fd has to be in the list!
      THROW (IOException, "select reports ready to write, but our fd isn't"
                          " in the list, this shouldn't happen!");
    }
  }
  return bytes_written;
}